

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.h
# Opt level: O0

UniformWeighting * __thiscall
CoreML::Specification::KNearestNeighborsClassifier::mutable_uniformweighting
          (KNearestNeighborsClassifier *this)

{
  bool bVar1;
  UniformWeighting *this_00;
  KNearestNeighborsClassifier *this_local;
  
  bVar1 = has_uniformweighting(this);
  if (!bVar1) {
    clear_WeightingScheme(this);
    set_has_uniformweighting(this);
    this_00 = (UniformWeighting *)operator_new(0x18);
    UniformWeighting::UniformWeighting(this_00);
    (this->WeightingScheme_).uniformweighting_ = this_00;
  }
  return (this->WeightingScheme_).uniformweighting_;
}

Assistant:

inline ::CoreML::Specification::UniformWeighting* KNearestNeighborsClassifier::mutable_uniformweighting() {
  if (!has_uniformweighting()) {
    clear_WeightingScheme();
    set_has_uniformweighting();
    WeightingScheme_.uniformweighting_ = new ::CoreML::Specification::UniformWeighting;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.KNearestNeighborsClassifier.uniformWeighting)
  return WeightingScheme_.uniformweighting_;
}